

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O2

void __thiscall PF_BufferMgr::PF_BufferMgr(PF_BufferMgr *this,int _numPages)

{
  PF_BufPageDesc *pPVar1;
  void *__s;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  PF_HashTable::PF_HashTable(&this->hashTable,0x14);
  this->numPages = _numPages;
  this->pageSize = 0x1000;
  pStatisticsMgr = (StatisticsMgr *)operator_new(0x28);
  (pStatisticsMgr->llStats).iLength = 0;
  (pStatisticsMgr->llStats).pnLastRef = (InternalNode *)0x0;
  (pStatisticsMgr->llStats).pnHead = (InternalNode *)0x0;
  (pStatisticsMgr->llStats).pnTail = (InternalNode *)0x0;
  (pStatisticsMgr->llStats).iLastRef = -1;
  uVar4 = 0xffffffffffffffff;
  if (-1 < _numPages) {
    uVar4 = (ulong)(uint)_numPages << 5;
  }
  pPVar1 = (PF_BufPageDesc *)operator_new__(uVar4);
  this->bufTable = pPVar1;
  lVar3 = 0;
  uVar4 = 0;
  if (0 < _numPages) {
    uVar4 = (ulong)(uint)_numPages;
  }
  iVar2 = -1;
  for (; uVar4 * 0x20 != lVar3; lVar3 = lVar3 + 0x20) {
    __s = operator_new__(0x1000);
    *(void **)((long)&pPVar1->pData + lVar3) = __s;
    memset(__s,0,0x1000);
    *(int *)((long)&pPVar1->prev + lVar3) = iVar2;
    *(int *)((long)&pPVar1->next + lVar3) = iVar2 + 2;
    iVar2 = iVar2 + 1;
  }
  pPVar1[(long)_numPages + -1].next = -1;
  pPVar1->prev = -1;
  this->free = 0;
  this->first = -1;
  this->last = -1;
  return;
}

Assistant:

PF_BufferMgr::PF_BufferMgr(int _numPages) : hashTable(PF_HASH_TBL_SIZE)
{
   // Initialize local variables
   this->numPages = _numPages;
   pageSize = PF_PAGE_SIZE + sizeof(PF_PageHdr);

#ifdef PF_STATS
   // Initialize the global variable for the statistics manager
   pStatisticsMgr = new StatisticsMgr();
#endif

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Creating buffer manager. %d pages of size %d.\n",
         numPages, PF_PAGE_SIZE+sizeof(PF_PageHdr));
   WriteLog(psMessage);
#endif

   // Allocate memory for buffer page description table
   bufTable = new PF_BufPageDesc[numPages];

   // Initialize the buffer table and allocate memory for buffer pages.
   // Initially, the free list contains all pages
   for (int i = 0; i < numPages; i++) {
      if ((bufTable[i].pData = new char[pageSize]) == NULL) {
         cerr << "Not enough memory for buffer\n";
         exit(1);
      }

      memset ((void *)bufTable[i].pData, 0, pageSize);

      bufTable[i].prev = i - 1;
      bufTable[i].next = i + 1;
   }
   bufTable[0].prev = bufTable[numPages - 1].next = INVALID_SLOT;
   free = 0;
   first = last = INVALID_SLOT;

#ifdef PF_LOG
   WriteLog("Succesfully created the buffer manager.\n");
#endif
}